

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_boost.cpp
# Opt level: O0

void __thiscall
jetbrains::teamcity::TeamcityBoostLogFormatter::log_entry_start
          (TeamcityBoostLogFormatter *this,ostream *param_1,log_entry_data *entry_data,
          log_entry_types param_3)

{
  ostream *poVar1;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  log_entry_types local_24;
  log_entry_data *plStack_20;
  log_entry_types param_3_local;
  log_entry_data *entry_data_local;
  ostream *param_1_local;
  TeamcityBoostLogFormatter *this_local;
  
  local_24 = param_3;
  plStack_20 = entry_data;
  entry_data_local = (log_entry_data *)param_1;
  param_1_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1b0,_S_out);
  poVar1 = std::operator<<(local_1a0,(string *)plStack_20);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)((string *)plStack_20 + 0x20));
  std::operator<<(poVar1,": ");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=((string *)&this->currentDetails,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void TeamcityBoostLogFormatter::log_entry_start(
    std::ostream& /*out*/
  , const boost::unit_test::log_entry_data& entry_data
  , log_entry_types /*let*/
  )
{
    std::stringstream ss(std::ios_base::out);
    ss  << entry_data.m_file_name << ':' << entry_data.m_line_num << ": ";
    currentDetails += ss.str();
}